

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_pgroup(Integer g_a,Integer p_handle)

{
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set processor configuration on array that has been allocated",0);
  }
  if ((GA_World_Proc_Group != p_handle) && (PGRP_LIST[p_handle].actv != 1)) {
    pnga_error("Processor group does not exist",0);
    return;
  }
  GA[g_a + 1000].p_handle = (int)p_handle;
  return;
}

Assistant:

void pnga_set_pgroup(Integer g_a, Integer p_handle)
{
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set processor configuration on array that has been allocated",0);
  if (p_handle == GA_World_Proc_Group || PGRP_LIST[p_handle].actv == 1) {
    GA[ga_handle].p_handle = (int) (p_handle);
  } else {
    pnga_error("Processor group does not exist",0);
  }
}